

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rst_display_driver.cpp
# Opt level: O2

void __thiscall RstDisplayDriver::display(RstDisplayDriver *this,Document *doc,ostream *output)

{
  undefined4 uVar1;
  int iVar2;
  ulong uVar3;
  long *plVar4;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ostream *poVar11;
  char cVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  ulong local_1f0;
  Document *local_1e8;
  ulong local_1e0;
  string local_1d8 [32];
  stringstream url_data;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&url_data);
  uVar5 = 0;
  local_1e8 = doc;
  do {
    uVar3 = Document::size();
    if (uVar3 <= uVar5) {
      std::__cxx11::stringbuf::str();
      std::operator<<(output,(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::stringstream::~stringstream((stringstream *)&url_data);
      return;
    }
    plVar4 = (long *)Document::operator[]((ulong)doc);
    uVar1 = (**(code **)(*plVar4 + 8))();
    pcVar13 = "- ";
    switch(uVar1) {
    case 7:
      pcVar13 = "#) ";
      break;
    case 8:
      break;
    default:
      goto switchD_0012c45b_caseD_9;
    case 10:
      pcVar13 = "    ";
      break;
    case 0xb:
      poVar11 = std::operator<<(output,"::");
      poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
      std::endl<char,std::char_traits<char>>(poVar11);
      goto switchD_0012c45b_caseD_9;
    }
    std::operator<<(output,pcVar13);
switchD_0012c45b_caseD_9:
    lVar14 = 0;
    local_1f0 = 0;
    local_1e0 = uVar5;
    while (uVar5 = Paragraph::size(), local_1f0 < uVar5) {
      plVar6 = (long *)Paragraph::operator[]((ulong)plVar4);
      if (plVar6 == (long *)0x0) {
        bVar16 = true;
        bVar17 = true;
LAB_0012c58f:
        lVar8 = 0;
        bVar15 = true;
      }
      else {
        lVar7 = __dynamic_cast(plVar6,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
        lVar8 = __dynamic_cast(plVar6,&LineElement::typeinfo,&UrlLineElement::typeinfo);
        lVar9 = __dynamic_cast(plVar6,&LineElement::typeinfo,&BoldLineElement::typeinfo);
        bVar15 = lVar9 == 0;
        lVar10 = __dynamic_cast(plVar6,&LineElement::typeinfo,&ItalicLineElement::typeinfo);
        bVar16 = lVar10 == 0;
        bVar17 = lVar7 == 0;
        if ((bVar17) || (iVar2 = (**(code **)(*plVar4 + 8))(), iVar2 == 0xb)) {
          if (lVar8 == 0) {
            if (lVar9 == 0) {
              bVar16 = lVar10 == 0;
              if (!bVar16) {
                std::operator<<(output,"*");
              }
              goto LAB_0012c58f;
            }
            std::operator<<(output,"**");
            lVar8 = 0;
            bVar15 = false;
          }
          else {
            std::operator<<(output,"`");
          }
        }
        else {
          std::operator<<(output,"``");
          bVar17 = false;
        }
      }
      (**(code **)(*plVar6 + 0x10))((string *)&local_210,plVar6);
      lVar14 = lVar14 + local_208;
      std::__cxx11::string::~string((string *)&local_210);
      (**(code **)(*plVar6 + 0x10))((string *)&local_210,plVar6);
      std::operator<<(output,(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      if (bVar17) {
LAB_0012c634:
        if (lVar8 == 0) {
          pcVar13 = "**";
          if (bVar15) {
            pcVar13 = "*";
          }
          if (!(bool)(bVar16 & bVar15)) goto LAB_0012c6ea;
        }
        else {
          std::operator<<(output,"`_");
          poVar11 = std::operator<<(local_1a8,".. _");
          (**(code **)(*plVar6 + 0x10))((string *)&local_210,plVar6);
          poVar11 = std::operator<<(poVar11,(string *)&local_210);
          poVar11 = std::operator<<(poVar11," : ");
          UrlLineElement::url_abi_cxx11_();
          poVar11 = std::operator<<(poVar11,local_1d8);
          std::endl<char,std::char_traits<char>>(poVar11);
          std::__cxx11::string::~string(local_1d8);
          std::__cxx11::string::~string((string *)&local_210);
        }
      }
      else {
        iVar2 = (**(code **)(*plVar4 + 8))();
        pcVar13 = "``";
        if (iVar2 == 0xb) goto LAB_0012c634;
LAB_0012c6ea:
        std::operator<<(output,pcVar13);
      }
      local_1f0 = local_1f0 + 1;
    }
    iVar2 = (**(code **)(*plVar4 + 8))();
    uVar5 = local_1e0;
    doc = local_1e8;
    cVar12 = (char)lVar14;
    if (iVar2 == 3) {
      poVar11 = std::endl<char,std::char_traits<char>>(output);
      local_210 = local_200;
      std::__cxx11::string::_M_construct((ulong)&local_210,cVar12);
      std::operator<<(poVar11,(string *)&local_210);
LAB_0012c7ee:
      std::__cxx11::string::~string((string *)&local_210);
    }
    else {
      if (iVar2 == 2) {
        poVar11 = std::endl<char,std::char_traits<char>>(output);
        local_210 = local_200;
        std::__cxx11::string::_M_construct((ulong)&local_210,cVar12);
        std::operator<<(poVar11,(string *)&local_210);
        goto LAB_0012c7ee;
      }
      if (iVar2 == 1) {
        poVar11 = std::endl<char,std::char_traits<char>>(output);
        local_210 = local_200;
        std::__cxx11::string::_M_construct((ulong)&local_210,cVar12);
        std::operator<<(poVar11,(string *)&local_210);
        goto LAB_0012c7ee;
      }
    }
    poVar11 = std::endl<char,std::char_traits<char>>(output);
    std::endl<char,std::char_traits<char>>(poVar11);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void RstDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p(nullptr);
	LineElement *l(nullptr);
	CodeLineElement *code_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	BoldLineElement *bold_le(nullptr);
	UrlLineElement *url_le(nullptr);
	size_t text_len(0);
	stringstream url_data;

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::UList1:
				output << "- ";
				break;
			case Paragraph::Level::OList1:
				output << "#) ";
				break;
			case Paragraph::Level::Quote:
				output << "    ";
				break;
			case Paragraph::Level::Code:
				output << "::" << endl << endl;
				break;
			default:
				break;

		}
		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];
			
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);
			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "``";
			} else if (url_le) {
				output << "`";
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}

			text_len += l->content().length();
			output << l->content();
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "``";
			} else if (url_le) {
				output << "`_";
				url_data << ".. _" << l->content() << " : " << url_le->url() << endl;
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}
		}

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << endl << std::string(text_len, '=');
				break;
			case Paragraph::Level::Title2:
				output << endl << std::string(text_len, '-');
				break;
			case Paragraph::Level::Title3:
				output << endl << std::string(text_len, '~');
				break;
			default:
				break;

		}

		text_len = 0;
		output << endl << endl;
	}

	output << url_data.str();
}